

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingReporter.cpp
# Opt level: O1

void __thiscall jaegertracing::reporters::LoggingReporter::report(LoggingReporter *this,Span *span)

{
  Logger *pLVar1;
  ostringstream oss;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"Reporting span ",0xf);
  Span::print<std::ostream>(span,(basic_ostream<char,_std::char_traits<char>_> *)local_188);
  pLVar1 = this->_logger;
  std::__cxx11::stringbuf::str();
  (*pLVar1->_vptr_Logger[3])(pLVar1,local_1a8);
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base((ios_base *)(local_188 + 0x70));
  return;
}

Assistant:

void LoggingReporter::report(const Span& span) noexcept
{
    std::ostringstream oss;
    oss << "Reporting span " << span;
    _logger.info(oss.str());
}